

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_man.cpp
# Opt level: O0

void __thiscall FScriptPosition::Message(FScriptPosition *this,int severity,char *message,...)

{
  uint uVar1;
  char *pcVar2;
  char in_AL;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  bool local_141;
  undefined1 local_128 [24];
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  int local_6c;
  char *pcStack_68;
  int level;
  char *color;
  char *type;
  va_list arglist;
  FString local_28;
  FString composed;
  char *message_local;
  int severity_local;
  FScriptPosition *this_local;
  
  if (in_AL != '\0') {
    local_f8 = in_XMM0_Qa;
    local_e8 = in_XMM1_Qa;
    local_d8 = in_XMM2_Qa;
    local_c8 = in_XMM3_Qa;
    local_b8 = in_XMM4_Qa;
    local_a8 = in_XMM5_Qa;
    local_98 = in_XMM6_Qa;
    local_88 = in_XMM7_Qa;
  }
  local_110 = in_RCX;
  local_108 = in_R8;
  local_100 = in_R9;
  composed.Chars = message;
  FString::FString(&local_28);
  if (((((severity == 8) && (iVar3 = FIntCVar::operator_cast_to_int(&developer), iVar3 < 3)) ||
       ((severity == 4 && (iVar3 = FIntCVar::operator_cast_to_int(&developer), iVar3 < 1)))) ||
      ((severity == 5 && (iVar3 = FIntCVar::operator_cast_to_int(&developer), iVar3 < 2)))) ||
     ((severity == 6 && (iVar3 = FIntCVar::operator_cast_to_int(&developer), iVar3 < 3))))
  goto LAB_0065a014;
  message_local._4_4_ = severity;
  if (severity == 3) {
    local_141 = true;
    if ((StrictErrors & 1U) == 0) {
      local_141 = FBoolCVar::operator_cast_to_bool(&strictdecorate);
    }
    message_local._4_4_ = 0;
    if (local_141 != false) {
      message_local._4_4_ = 2;
    }
  }
  if (composed.Chars == (char *)0x0) {
    FString::operator=(&local_28,"Bad syntax.");
  }
  else {
    arglist[0].overflow_arg_area = local_128;
    arglist[0]._0_8_ = &stack0x00000008;
    type._4_4_ = 0x30;
    type._0_4_ = 0x18;
    FString::VFormat(&local_28,composed.Chars,(__va_list_tag *)&type);
  }
  color = "";
  local_6c = 2;
  switch(message_local._4_4_) {
  case 0:
  case 4:
  case 5:
    WarnCounter = WarnCounter + 1;
    color = "warning";
    pcStack_68 = "\x1cI";
    break;
  case 1:
    pcVar4 = FString::GetChars(&this->FileName);
    uVar1 = this->ScriptLine;
    pcVar5 = FString::GetChars(&local_28);
    I_Error("Script error, \"%s\" line %d:\n%s\n",pcVar4,(ulong)uVar1,pcVar5);
    goto LAB_0065a014;
  case 2:
    ErrorCounter = ErrorCounter + 1;
    color = "error";
    pcStack_68 = "\x1cG";
    break;
  default:
    goto LAB_0065a014;
  case 6:
  case 9:
    color = "message";
    pcStack_68 = "\x1cD";
    break;
  case 7:
  case 8:
    color = "message";
    local_6c = 5;
    pcStack_68 = "";
  }
  pcVar2 = color;
  pcVar4 = pcStack_68;
  iVar3 = local_6c;
  pcVar6 = FString::GetChars(&this->FileName);
  pcVar5 = pcStack_68;
  uVar1 = this->ScriptLine;
  pcVar7 = FString::GetChars(&local_28);
  Printf(iVar3,"%sScript %s, \"%s\" line %d:\n%s%s\n",pcVar4,pcVar2,pcVar6,(ulong)uVar1,pcVar5,
         pcVar7);
LAB_0065a014:
  FString::~FString(&local_28);
  return;
}

Assistant:

void FScriptPosition::Message (int severity, const char *message, ...) const
{
	FString composed;

	if (severity == MSG_DEBUGLOG && developer < DMSG_NOTIFY) return;
	if (severity == MSG_DEBUGERROR && developer < DMSG_ERROR) return;
	if (severity == MSG_DEBUGWARN && developer < DMSG_WARNING) return;
	if (severity == MSG_DEBUGMSG && developer < DMSG_NOTIFY) return;
	if (severity == MSG_OPTERROR)
	{
		severity = StrictErrors || strictdecorate ? MSG_ERROR : MSG_WARNING;
	}

	if (message == NULL)
	{
		composed = "Bad syntax.";
	}
	else
	{
		va_list arglist;
		va_start (arglist, message);
		composed.VFormat (message, arglist);
		va_end (arglist);
	}
	const char *type = "";
	const char *color;
	int level = PRINT_HIGH;

	switch (severity)
	{
	default:
		return;

	case MSG_WARNING:
	case MSG_DEBUGWARN:
	case MSG_DEBUGERROR:	// This is intentionally not being printed as an 'error', the difference to MSG_DEBUGWARN is only the severity level at which it gets triggered.
		WarnCounter++;
		type = "warning";
		color = TEXTCOLOR_ORANGE;
		break;

	case MSG_ERROR:
		ErrorCounter++;
		type = "error";
		color = TEXTCOLOR_RED;
		break;

	case MSG_MESSAGE:
	case MSG_DEBUGMSG:
		type = "message";
		color = TEXTCOLOR_GREEN;
		break;

	case MSG_DEBUGLOG:
	case MSG_LOG:
		type = "message";
		level = PRINT_LOG;
		color = "";
		break;

	case MSG_FATAL:
		I_Error ("Script error, \"%s\" line %d:\n%s\n",
			FileName.GetChars(), ScriptLine, composed.GetChars());
		return;
	}
	Printf (level, "%sScript %s, \"%s\" line %d:\n%s%s\n",
		color, type, FileName.GetChars(), ScriptLine, color, composed.GetChars());
}